

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn5.cc
# Opt level: O2

void __thiscall
trng::yarn5::seed(yarn5 *this,result_type s1,result_type s2,result_type s3,result_type s4,
                 result_type s5)

{
  int iVar1;
  int iVar2;
  
  (this->S).r[0] = (-(uint)(s1 % 0x7fffffff < 0) >> 1) + s1 % 0x7fffffff;
  (this->S).r[1] = (-(uint)(s2 % 0x7fffffff < 0) >> 1) + s2 % 0x7fffffff;
  (this->S).r[2] = (-(uint)(s3 % 0x7fffffff < 0) >> 1) + s3 % 0x7fffffff;
  (this->S).r[3] = (-(uint)(s4 % 0x7fffffff < 0) >> 1) + s4 % 0x7fffffff;
  iVar1 = s5 % 0x7fffffff;
  iVar2 = iVar1 + 0x7fffffff;
  if (-1 < iVar1) {
    iVar2 = iVar1;
  }
  (this->S).r[4] = iVar2;
  return;
}

Assistant:

void yarn5::seed(yarn5::result_type s1, yarn5::result_type s2, yarn5::result_type s3,
                   yarn5::result_type s4, yarn5::result_type s5) {
    S.r[0] = s1 % modulus;
    if (S.r[0] < 0)
      S.r[0] += modulus;
    S.r[1] = s2 % modulus;
    if (S.r[1] < 0)
      S.r[1] += modulus;
    S.r[2] = s3 % modulus;
    if (S.r[2] < 0)
      S.r[2] += modulus;
    S.r[3] = s4 % modulus;
    if (S.r[3] < 0)
      S.r[3] += modulus;
    S.r[4] = s5 % modulus;
    if (S.r[4] < 0)
      S.r[4] += modulus;
  }